

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetCFBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  cmValue cVar2;
  char *pcVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string ext;
  size_type __dnew;
  undefined1 *local_a0;
  char *local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  string local_70;
  string local_50;
  
  GetOutputName(&local_50,this,config,RuntimeBinaryArtifact);
  local_a0 = (undefined1 *)0x1;
  local_90 = 0x2e;
  local_70._M_dataplus._M_p = (pointer)local_50._M_string_length;
  local_70._M_string_length = (size_type)local_50._M_dataplus._M_p;
  local_70.field_2._M_allocated_capacity = 1;
  views._M_len = 2;
  views._M_array = (iterator)&local_70;
  local_98 = &local_90;
  local_70.field_2._8_8_ = &local_90;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_98 = (char *)0x0;
  local_90 = 0;
  local_50._M_dataplus._M_p = (pointer)0x10;
  local_a0 = &local_90;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_50);
  local_70.field_2._M_allocated_capacity = (size_type)local_50._M_dataplus._M_p;
  builtin_strncpy(local_70._M_dataplus._M_p,"BUNDLE_EXTENSION",0x10);
  local_70._M_string_length = (size_type)local_50._M_dataplus._M_p;
  local_70._M_dataplus._M_p[(long)local_50._M_dataplus._M_p] = '\0';
  cVar2 = GetProperty(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1));
  }
  if (cVar2.Value == (string *)0x0) {
    bVar1 = IsXCTestOnApple(this);
    pcVar3 = "bundle";
    if (bVar1) {
      pcVar3 = "xctest";
    }
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,local_98,(ulong)pcVar3);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_a0);
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
  if (level - ContentLevel < 2) {
    bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
    if (!bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (level == FullLevel) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCFBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath = cmStrCat(
    this->GetOutputName(config, cmStateEnums::RuntimeBinaryArtifact), '.');
  std::string ext;
  if (cmValue p = this->GetProperty("BUNDLE_EXTENSION")) {
    ext = *p;
  } else {
    if (this->IsXCTestOnApple()) {
      ext = "xctest";
    } else {
      ext = "bundle";
    }
  }
  fpath += ext;
  if (shouldAddContentLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}